

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * mp_from_integer(uintmax_t n)

{
  mp_int *pmVar1;
  ulong local_20;
  size_t i;
  mp_int *x;
  uintmax_t n_local;
  
  pmVar1 = mp_make_sized(1);
  for (local_20 = 0; local_20 < pmVar1->nw; local_20 = local_20 + 1) {
    pmVar1->w[local_20] = n;
  }
  return pmVar1;
}

Assistant:

mp_int *mp_from_integer(uintmax_t n)
{
    mp_int *x = mp_make_sized(
        (sizeof(n) + BIGNUM_INT_BYTES - 1) / BIGNUM_INT_BYTES);
    for (size_t i = 0; i < x->nw; i++)
        x->w[i] = n >> (i * BIGNUM_INT_BITS);
    return x;
}